

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::InitWeakDefaults(void)

{
  WeakDescriptorDefaultTail *pWVar1;
  Message *instance;
  WeakDescriptorDefaultTail *tail;
  char *end;
  char *start;
  
  tail = (WeakDescriptorDefaultTail *)&__bss_start;
  while (tail != (WeakDescriptorDefaultTail *)&dummy_weak_default) {
    pWVar1 = tail + -1;
    tail = (WeakDescriptorDefaultTail *)((long)tail - tail[-1].size);
    *pWVar1->target = (Message *)tail;
  }
  return;
}

Assistant:

static void InitWeakDefaults() {
  // force link the dummy entry.
  StrongPointer<DummyWeakDefault*, &dummy_weak_default>();
  // We don't know the size of each object, but we know the layout of the tail.
  // It contains a WeakDescriptorDefaultTail object.
  // As such, we iterate the section backwards.
  const char* start = &__start_pb_defaults;
  const char* end = &__stop_pb_defaults;
  while (start != end) {
    auto* tail = reinterpret_cast<const WeakDescriptorDefaultTail*>(end) - 1;
    end -= tail->size;
    const Message* instance = reinterpret_cast<const Message*>(end);
    *tail->target = instance;
  }
}